

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  
  pFVar3 = this->right_;
  pFVar4 = (this->left_->fadexpr_).left_;
  pFVar5 = (this->left_->fadexpr_).right_;
  pFVar6 = (pFVar4->fadexpr_).right_;
  pdVar9 = &pFVar6->defaultVal;
  if ((pFVar6->dx_).num_elts != 0) {
    pdVar9 = (pFVar6->dx_).ptr_to_data + i;
  }
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  pdVar8 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar8 = (pFVar5->dx_).ptr_to_data + i;
  }
  dVar10 = dVar1 * pFVar6->val_;
  dVar2 = pFVar3->val_;
  pdVar7 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar7 = (pFVar3->dx_).ptr_to_data + i;
  }
  return ((*pdVar9 * dVar1 * pFVar5->val_ + *pdVar8 * dVar10) * dVar2 -
         dVar10 * pFVar5->val_ * *pdVar7) / (dVar2 * dVar2);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}